

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

lua_Number lua_tonumber(lua_State *L,int idx)

{
  int iVar1;
  TValue in_RAX;
  TValue *pTVar2;
  ulong uVar3;
  TValue TVar4;
  TValue tmp;
  TValue local_8;
  
  local_8 = in_RAX;
  pTVar2 = index2adr(L,idx);
  uVar3 = pTVar2->it64 >> 0x2f;
  if (uVar3 < 0xfffffffffffffff3) {
    TVar4.u64 = pTVar2->u64;
  }
  else {
    TVar4.u64 = 0;
    if (uVar3 == 0xfffffffffffffffb) {
      iVar1 = lj_strscan_num((GCstr *)(pTVar2->it64 & 0x7fffffffffff),&local_8);
      TVar4.u64 = 0;
      if (iVar1 != 0) {
        TVar4 = local_8;
      }
    }
  }
  return (lua_Number)TVar4.u64;
}

Assistant:

LUA_API lua_Number lua_tonumber(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  if (LJ_LIKELY(tvisnumber(o)))
    return numberVnum(o);
  else if (tvisstr(o) && lj_strscan_num(strV(o), &tmp))
    return numV(&tmp);
  else
    return 0;
}